

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

char * FBehavior::StaticLookupString(DWORD index)

{
  uint uVar1;
  uint uVar2;
  FBehavior **ppFVar3;
  DWORD lib;
  DWORD index_local;
  
  uVar1 = index >> 0x14;
  if (uVar1 == 0x7ff) {
    _lib = ACSStringPool::GetString(&GlobalACSStrings,index);
  }
  else {
    uVar2 = TArray<FBehavior_*,_FBehavior_*>::Size(&StaticModules);
    if (uVar1 < uVar2) {
      ppFVar3 = TArray<FBehavior_*,_FBehavior_*>::operator[](&StaticModules,(ulong)uVar1);
      _lib = LookupString(*ppFVar3,index & 0xffff);
    }
    else {
      _lib = (char *)0x0;
    }
  }
  return _lib;
}

Assistant:

const char *FBehavior::StaticLookupString (DWORD index)
{
	DWORD lib = index >> LIBRARYID_SHIFT;

	if (lib == STRPOOL_LIBRARYID)
	{
		return GlobalACSStrings.GetString(index);
	}
	if (lib >= (DWORD)StaticModules.Size())
	{
		return NULL;
	}
	return StaticModules[lib]->LookupString (index & 0xffff);
}